

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

RotationalInertia * __thiscall
iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass
          (RotationalInertia *__return_storage_ptr__,SpatialInertia *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ActualDstType actualDst;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  Vector3d local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  
  RotationalInertia::RotationalInertia(__return_storage_ptr__);
  if (this->m_mass == 0.0) {
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[1];
    (__return_storage_ptr__->super_Matrix3x3).m_data[0] =
         (this->m_rotInertia).super_Matrix3x3.m_data[0];
    (__return_storage_ptr__->super_Matrix3x3).m_data[1] = dVar1;
    dVar10 = (this->m_rotInertia).super_Matrix3x3.m_data[2];
    dVar11 = (this->m_rotInertia).super_Matrix3x3.m_data[3];
    dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[4];
    dVar6 = (this->m_rotInertia).super_Matrix3x3.m_data[5];
    dVar7 = (this->m_rotInertia).super_Matrix3x3.m_data[6];
    dVar9 = (this->m_rotInertia).super_Matrix3x3.m_data[7];
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[8];
  }
  else {
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = this->m_mcom[0];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = this->m_mcom[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = this->m_mcom[2];
    squareCrossProductMatrix(&local_88);
    dVar1 = this->m_mass;
    dVar10 = (this->m_rotInertia).super_Matrix3x3.m_data[1];
    auVar8._8_8_ = dVar1;
    auVar8._0_8_ = dVar1;
    auVar8 = divpd(local_68,auVar8);
    (__return_storage_ptr__->super_Matrix3x3).m_data[0] =
         auVar8._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[0];
    (__return_storage_ptr__->super_Matrix3x3).m_data[1] = auVar8._8_8_ + dVar10;
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar8 = divpd(local_58,auVar2);
    dVar10 = (this->m_rotInertia).super_Matrix3x3.m_data[2] + auVar8._0_8_;
    dVar11 = (this->m_rotInertia).super_Matrix3x3.m_data[3] + auVar8._8_8_;
    auVar3._8_8_ = dVar1;
    auVar3._0_8_ = dVar1;
    auVar8 = divpd(local_48,auVar3);
    dVar5 = auVar8._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[4];
    dVar6 = auVar8._8_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[5];
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar8 = divpd(local_38,auVar4);
    dVar7 = auVar8._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[6];
    dVar9 = auVar8._8_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[7];
    dVar1 = local_28 / dVar1 + (this->m_rotInertia).super_Matrix3x3.m_data[8];
  }
  (__return_storage_ptr__->super_Matrix3x3).m_data[2] = dVar10;
  (__return_storage_ptr__->super_Matrix3x3).m_data[3] = dVar11;
  (__return_storage_ptr__->super_Matrix3x3).m_data[4] = dVar5;
  (__return_storage_ptr__->super_Matrix3x3).m_data[5] = dVar6;
  (__return_storage_ptr__->super_Matrix3x3).m_data[6] = dVar7;
  (__return_storage_ptr__->super_Matrix3x3).m_data[7] = dVar9;
  (__return_storage_ptr__->super_Matrix3x3).m_data[8] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

RotationalInertia SpatialInertia::getRotationalInertiaWrtCenterOfMass() const
{
    RotationalInertia retComInertia;
    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<const Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<Eigen::Matrix3d> comInertia(retComInertia.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0 )
    {
        comInertia = linkInertia + squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        comInertia = linkInertia;
    }

    return retComInertia;
}